

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 (*pauVar64) [16];
  undefined4 uVar65;
  uint uVar66;
  AABBNodeMB4D *node1;
  ulong uVar67;
  long lVar68;
  long lVar69;
  int iVar70;
  ulong uVar71;
  long lVar72;
  uint uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  long lVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  Scene *scene;
  ulong uVar89;
  long lVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar97 [16];
  float fVar111;
  undefined1 auVar102 [32];
  undefined1 auVar98 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar109;
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar108 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar122;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [32];
  undefined1 auVar131 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar149;
  undefined1 auVar148 [64];
  float fVar156;
  undefined1 auVar151 [16];
  float fVar150;
  undefined1 auVar152 [32];
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar153 [64];
  float fVar160;
  undefined1 auVar161 [32];
  float fVar163;
  float fVar164;
  uint uVar165;
  float fVar166;
  float fVar167;
  uint uVar168;
  float fVar169;
  uint uVar170;
  float fVar171;
  uint uVar172;
  float fVar173;
  uint uVar174;
  uint uVar175;
  undefined1 auVar162 [64];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar183 [32];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar194 [32];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar195 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 (*local_1608) [16];
  ulong local_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 local_1550;
  undefined8 uStack_1548;
  RTCFilterFunctionNArguments local_1530;
  undefined1 local_1500 [8];
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  undefined4 uStack_14e4;
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1450 [16];
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float local_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  undefined1 local_1410 [16];
  undefined1 local_1400 [16];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [8];
  float fStack_13d8;
  float fStack_13d4;
  undefined1 local_13d0 [8];
  float fStack_13c8;
  float fStack_13c4;
  undefined1 local_13c0 [8];
  float fStack_13b8;
  float fStack_13b4;
  undefined1 local_13b0 [8];
  float fStack_13a8;
  float fStack_13a4;
  undefined1 local_13a0 [8];
  float fStack_1398;
  float fStack_1394;
  undefined1 local_1390 [8];
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [8];
  float fStack_1378;
  float fStack_1374;
  undefined1 local_1370 [8];
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1360 [8];
  float fStack_1358;
  float fStack_1354;
  undefined1 local_1350 [8];
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1340 [8];
  float fStack_1338;
  float fStack_1334;
  undefined1 local_1330 [16];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_1608 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar65 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_13f0._4_4_ = uVar65;
  local_13f0._0_4_ = uVar65;
  local_13f0._8_4_ = uVar65;
  local_13f0._12_4_ = uVar65;
  auVar148 = ZEXT1664(local_13f0);
  uVar65 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1400._4_4_ = uVar65;
  local_1400._0_4_ = uVar65;
  local_1400._8_4_ = uVar65;
  local_1400._12_4_ = uVar65;
  auVar153 = ZEXT1664(local_1400);
  uVar65 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1410._4_4_ = uVar65;
  local_1410._0_4_ = uVar65;
  local_1410._8_4_ = uVar65;
  local_1410._12_4_ = uVar65;
  auVar162 = ZEXT1664(local_1410);
  local_1420 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1430 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1440 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  uVar93 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar89 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar91 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar70 = (tray->tnear).field_0.i[k];
  local_1450._4_4_ = iVar70;
  local_1450._0_4_ = iVar70;
  local_1450._8_4_ = iVar70;
  local_1450._12_4_ = iVar70;
  auVar195 = ZEXT1664(local_1450);
  iVar70 = (tray->tfar).field_0.i[k];
  auVar108 = ZEXT1664(CONCAT412(iVar70,CONCAT48(iVar70,CONCAT44(iVar70,iVar70))));
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  uVar73 = 1 << ((byte)k & 0x1f);
  uVar71 = (ulong)((uVar73 & 0xf) << 4);
  lVar72 = (long)((int)uVar73 >> 4) * 0x10;
  auVar132._8_4_ = 0x3f800000;
  auVar132._0_8_ = &DAT_3f8000003f800000;
  auVar132._12_4_ = 0x3f800000;
  auVar132._16_4_ = 0x3f800000;
  auVar132._20_4_ = 0x3f800000;
  auVar132._24_4_ = 0x3f800000;
  auVar132._28_4_ = 0x3f800000;
  auVar106._8_4_ = 0xbf800000;
  auVar106._0_8_ = 0xbf800000bf800000;
  auVar106._12_4_ = 0xbf800000;
  auVar106._16_4_ = 0xbf800000;
  auVar106._20_4_ = 0xbf800000;
  auVar106._24_4_ = 0xbf800000;
  auVar106._28_4_ = 0xbf800000;
  _local_1120 = vblendvps_avx(auVar132,auVar106,local_1100);
  fVar95 = local_1420;
  fVar109 = local_1420;
  fVar110 = local_1420;
  fVar111 = local_1420;
  fVar112 = local_1430;
  fVar113 = local_1430;
  fVar114 = local_1430;
  fVar122 = local_1430;
  fVar166 = local_1440;
  fVar149 = local_1440;
  fVar186 = local_1440;
  fVar188 = local_1440;
  fStack_143c = local_1440;
  fStack_1438 = local_1440;
  fStack_1434 = local_1440;
  fStack_142c = local_1430;
  fStack_1428 = local_1430;
  fStack_1424 = local_1430;
  fStack_141c = local_1420;
  fStack_1418 = local_1420;
  fStack_1414 = local_1420;
  do {
    do {
      do {
        if (local_1608 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar64 = local_1608 + -1;
        local_1608 = local_1608 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar64 + 8));
      uVar92 = *(ulong *)*local_1608;
      do {
        if ((uVar92 & 8) == 0) {
          uVar67 = uVar92 & 0xfffffffffffffff0;
          fVar3 = *(float *)(ray + k * 4 + 0xe0);
          auVar151._4_4_ = fVar3;
          auVar151._0_4_ = fVar3;
          auVar151._8_4_ = fVar3;
          auVar151._12_4_ = fVar3;
          pfVar2 = (float *)(uVar67 + 0x80 + uVar93);
          pfVar1 = (float *)(uVar67 + 0x20 + uVar93);
          auVar98._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar98._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar98._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar98._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar98 = vsubps_avx(auVar98,auVar148._0_16_);
          auVar115._0_4_ = fVar95 * auVar98._0_4_;
          auVar115._4_4_ = fVar109 * auVar98._4_4_;
          auVar115._8_4_ = fVar110 * auVar98._8_4_;
          auVar115._12_4_ = fVar111 * auVar98._12_4_;
          auVar98 = vmaxps_avx(auVar195._0_16_,auVar115);
          pfVar2 = (float *)(uVar67 + 0x80 + uVar89);
          pfVar1 = (float *)(uVar67 + 0x20 + uVar89);
          auVar97._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar97._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar97._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar97._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar115 = vsubps_avx(auVar97,auVar153._0_16_);
          auVar128._0_4_ = fVar112 * auVar115._0_4_;
          auVar128._4_4_ = fVar113 * auVar115._4_4_;
          auVar128._8_4_ = fVar114 * auVar115._8_4_;
          auVar128._12_4_ = fVar122 * auVar115._12_4_;
          pfVar2 = (float *)(uVar67 + 0x80 + uVar91);
          pfVar1 = (float *)(uVar67 + 0x20 + uVar91);
          auVar134._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar134._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar134._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar134._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar115 = vsubps_avx(auVar134,auVar162._0_16_);
          auVar135._0_4_ = fVar166 * auVar115._0_4_;
          auVar135._4_4_ = fVar149 * auVar115._4_4_;
          auVar135._8_4_ = fVar186 * auVar115._8_4_;
          auVar135._12_4_ = fVar188 * auVar115._12_4_;
          auVar115 = vmaxps_avx(auVar128,auVar135);
          auVar98 = vmaxps_avx(auVar98,auVar115);
          pfVar2 = (float *)(uVar67 + 0x80 + (uVar93 ^ 0x10));
          pfVar1 = (float *)(uVar67 + 0x20 + (uVar93 ^ 0x10));
          auVar129._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar129._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar129._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar129._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar115 = vsubps_avx(auVar129,auVar148._0_16_);
          auVar130._0_4_ = fVar95 * auVar115._0_4_;
          auVar130._4_4_ = fVar109 * auVar115._4_4_;
          auVar130._8_4_ = fVar110 * auVar115._8_4_;
          auVar130._12_4_ = fVar111 * auVar115._12_4_;
          pfVar2 = (float *)(uVar67 + 0x80 + (uVar89 ^ 0x10));
          pfVar1 = (float *)(uVar67 + 0x20 + (uVar89 ^ 0x10));
          auVar136._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar136._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar136._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar136._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar115 = vsubps_avx(auVar136,auVar153._0_16_);
          auVar137._0_4_ = fVar112 * auVar115._0_4_;
          auVar137._4_4_ = fVar113 * auVar115._4_4_;
          auVar137._8_4_ = fVar114 * auVar115._8_4_;
          auVar137._12_4_ = fVar122 * auVar115._12_4_;
          pfVar2 = (float *)(uVar67 + 0x80 + (uVar91 ^ 0x10));
          pfVar1 = (float *)(uVar67 + 0x20 + (uVar91 ^ 0x10));
          auVar139._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar139._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar139._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar139._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar115 = vsubps_avx(auVar139,auVar162._0_16_);
          auVar140._0_4_ = fVar166 * auVar115._0_4_;
          auVar140._4_4_ = fVar149 * auVar115._4_4_;
          auVar140._8_4_ = fVar186 * auVar115._8_4_;
          auVar140._12_4_ = fVar188 * auVar115._12_4_;
          auVar115 = vminps_avx(auVar137,auVar140);
          auVar97 = vminps_avx(auVar108._0_16_,auVar130);
          auVar115 = vminps_avx(auVar97,auVar115);
          if (((uint)uVar92 & 7) == 6) {
            auVar97 = vcmpps_avx(auVar98,auVar115,2);
            auVar115 = vcmpps_avx(*(undefined1 (*) [16])(uVar67 + 0xe0),auVar151,2);
            auVar151 = vcmpps_avx(auVar151,*(undefined1 (*) [16])(uVar67 + 0xf0),1);
            auVar115 = vandps_avx(auVar115,auVar151);
            auVar115 = vandps_avx(auVar115,auVar97);
          }
          else {
            auVar115 = vcmpps_avx(auVar98,auVar115,2);
          }
          auVar115 = vpslld_avx(auVar115,0x1f);
          uVar65 = vmovmskps_avx(auVar115);
          local_1568 = CONCAT44((int)(uVar67 >> 0x20),uVar65);
          local_1300._0_16_ = auVar98;
        }
        if ((uVar92 & 8) == 0) {
          if (local_1568 == 0) {
            iVar70 = 4;
          }
          else {
            uVar67 = uVar92 & 0xfffffffffffffff0;
            lVar69 = 0;
            if (local_1568 != 0) {
              for (; (local_1568 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
              }
            }
            iVar70 = 0;
            uVar92 = *(ulong *)(uVar67 + lVar69 * 8);
            uVar81 = local_1568 - 1 & local_1568;
            if (uVar81 != 0) {
              uVar73 = *(uint *)(local_1300 + lVar69 * 4);
              lVar69 = 0;
              if (uVar81 != 0) {
                for (; (uVar81 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
                }
              }
              uVar74 = *(ulong *)(uVar67 + lVar69 * 8);
              uVar66 = *(uint *)(local_1300 + lVar69 * 4);
              uVar81 = uVar81 - 1 & uVar81;
              if (uVar81 == 0) {
                if (uVar73 < uVar66) {
                  *(ulong *)*local_1608 = uVar74;
                  *(uint *)(*local_1608 + 8) = uVar66;
                  local_1608 = local_1608 + 1;
                }
                else {
                  *(ulong *)*local_1608 = uVar92;
                  *(uint *)(*local_1608 + 8) = uVar73;
                  uVar92 = uVar74;
                  local_1608 = local_1608 + 1;
                }
              }
              else {
                auVar116._8_8_ = 0;
                auVar116._0_8_ = uVar92;
                auVar98 = vpunpcklqdq_avx(auVar116,ZEXT416(uVar73));
                auVar123._8_8_ = 0;
                auVar123._0_8_ = uVar74;
                auVar115 = vpunpcklqdq_avx(auVar123,ZEXT416(uVar66));
                lVar69 = 0;
                if (uVar81 != 0) {
                  for (; (uVar81 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
                  }
                }
                auVar131._8_8_ = 0;
                auVar131._0_8_ = *(ulong *)(uVar67 + lVar69 * 8);
                auVar151 = vpunpcklqdq_avx(auVar131,ZEXT416(*(uint *)(local_1300 + lVar69 * 4)));
                auVar97 = vpcmpgtd_avx(auVar115,auVar98);
                uVar81 = uVar81 - 1 & uVar81;
                if (uVar81 == 0) {
                  auVar128 = vpshufd_avx(auVar97,0xaa);
                  auVar97 = vblendvps_avx(auVar115,auVar98,auVar128);
                  auVar98 = vblendvps_avx(auVar98,auVar115,auVar128);
                  auVar115 = vpcmpgtd_avx(auVar151,auVar97);
                  auVar128 = vpshufd_avx(auVar115,0xaa);
                  auVar115 = vblendvps_avx(auVar151,auVar97,auVar128);
                  auVar97 = vblendvps_avx(auVar97,auVar151,auVar128);
                  auVar151 = vpcmpgtd_avx(auVar97,auVar98);
                  auVar128 = vpshufd_avx(auVar151,0xaa);
                  auVar151 = vblendvps_avx(auVar97,auVar98,auVar128);
                  auVar98 = vblendvps_avx(auVar98,auVar97,auVar128);
                  *local_1608 = auVar98;
                  local_1608[1] = auVar151;
                  uVar92 = auVar115._0_8_;
                  local_1608 = local_1608 + 2;
                }
                else {
                  lVar69 = 0;
                  if (uVar81 != 0) {
                    for (; (uVar81 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
                    }
                  }
                  auVar141._8_8_ = 0;
                  auVar141._0_8_ = *(ulong *)(uVar67 + lVar69 * 8);
                  auVar129 = vpunpcklqdq_avx(auVar141,ZEXT416(*(uint *)(local_1300 + lVar69 * 4)));
                  auVar128 = vpshufd_avx(auVar97,0xaa);
                  auVar97 = vblendvps_avx(auVar115,auVar98,auVar128);
                  auVar98 = vblendvps_avx(auVar98,auVar115,auVar128);
                  auVar115 = vpcmpgtd_avx(auVar129,auVar151);
                  auVar128 = vpshufd_avx(auVar115,0xaa);
                  auVar115 = vblendvps_avx(auVar129,auVar151,auVar128);
                  auVar151 = vblendvps_avx(auVar151,auVar129,auVar128);
                  auVar128 = vpcmpgtd_avx(auVar151,auVar98);
                  auVar129 = vpshufd_avx(auVar128,0xaa);
                  auVar128 = vblendvps_avx(auVar151,auVar98,auVar129);
                  auVar98 = vblendvps_avx(auVar98,auVar151,auVar129);
                  auVar151 = vpcmpgtd_avx(auVar115,auVar97);
                  auVar129 = vpshufd_avx(auVar151,0xaa);
                  auVar151 = vblendvps_avx(auVar115,auVar97,auVar129);
                  auVar115 = vblendvps_avx(auVar97,auVar115,auVar129);
                  auVar97 = vpcmpgtd_avx(auVar128,auVar115);
                  auVar129 = vpshufd_avx(auVar97,0xaa);
                  auVar97 = vblendvps_avx(auVar128,auVar115,auVar129);
                  auVar115 = vblendvps_avx(auVar115,auVar128,auVar129);
                  *local_1608 = auVar98;
                  local_1608[1] = auVar115;
                  local_1608[2] = auVar97;
                  uVar92 = auVar151._0_8_;
                  local_1608 = local_1608 + 3;
                }
              }
            }
          }
        }
        else {
          iVar70 = 6;
        }
      } while (iVar70 == 0);
    } while (iVar70 != 6);
    uVar67 = (ulong)((uint)uVar92 & 0xf);
    if (uVar67 != 8) {
      uVar92 = uVar92 & 0xfffffffffffffff0;
      lVar69 = 0;
      do {
        lVar68 = lVar69 * 0x60;
        pSVar5 = context->scene;
        pRVar6 = (pSVar5->geometries).items;
        pGVar7 = pRVar6[*(uint *)(uVar92 + 0x40 + lVar68)].ptr;
        fVar95 = (pGVar7->time_range).lower;
        fVar95 = pGVar7->fnumTimeSegments *
                 ((*(float *)(ray + k * 4 + 0xe0) - fVar95) / ((pGVar7->time_range).upper - fVar95))
        ;
        auVar98 = vroundss_avx(ZEXT416((uint)fVar95),ZEXT416((uint)fVar95),9);
        auVar98 = vminss_avx(auVar98,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
        auVar140 = vmaxss_avx(ZEXT816(0) << 0x20,auVar98);
        iVar70 = (int)auVar140._0_4_;
        lVar83 = (long)iVar70 * 0x38;
        lVar8 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar83);
        uVar82 = (ulong)*(uint *)(uVar92 + 4 + lVar68);
        auVar98 = *(undefined1 (*) [16])(lVar8 + (ulong)*(uint *)(uVar92 + lVar68) * 4);
        uVar74 = (ulong)*(uint *)(uVar92 + 0x10 + lVar68);
        auVar115 = *(undefined1 (*) [16])(lVar8 + uVar74 * 4);
        uVar75 = (ulong)*(uint *)(uVar92 + 0x20 + lVar68);
        auVar97 = *(undefined1 (*) [16])(lVar8 + uVar75 * 4);
        uVar76 = (ulong)*(uint *)(uVar92 + 0x30 + lVar68);
        auVar151 = *(undefined1 (*) [16])(lVar8 + uVar76 * 4);
        lVar8 = *(long *)&pRVar6[*(uint *)(uVar92 + 0x44 + lVar68)].ptr[2].numPrimitives;
        lVar9 = *(long *)(lVar8 + lVar83);
        auVar128 = *(undefined1 (*) [16])(lVar9 + uVar82 * 4);
        uVar77 = (ulong)*(uint *)(uVar92 + 0x14 + lVar68);
        auVar129 = *(undefined1 (*) [16])(lVar9 + uVar77 * 4);
        uVar78 = (ulong)*(uint *)(uVar92 + 0x24 + lVar68);
        auVar130 = *(undefined1 (*) [16])(lVar9 + uVar78 * 4);
        uVar79 = (ulong)*(uint *)(uVar92 + 0x34 + lVar68);
        auVar134 = *(undefined1 (*) [16])(lVar9 + uVar79 * 4);
        lVar9 = *(long *)&pRVar6[*(uint *)(uVar92 + 0x48 + lVar68)].ptr[2].numPrimitives;
        lVar10 = *(long *)(lVar9 + lVar83);
        uVar80 = (ulong)*(uint *)(uVar92 + 8 + lVar68);
        auVar135 = *(undefined1 (*) [16])(lVar10 + uVar80 * 4);
        uVar94 = (ulong)*(uint *)(uVar92 + 0x18 + lVar68);
        auVar136 = *(undefined1 (*) [16])(lVar10 + uVar94 * 4);
        uVar85 = (ulong)*(uint *)(uVar92 + 0x28 + lVar68);
        auVar137 = *(undefined1 (*) [16])(lVar10 + uVar85 * 4);
        uVar86 = (ulong)*(uint *)(uVar92 + 0x38 + lVar68);
        auVar139 = *(undefined1 (*) [16])(lVar10 + uVar86 * 4);
        fVar95 = fVar95 - auVar140._0_4_;
        local_1330 = ZEXT416((uint)fVar95);
        lVar10 = *(long *)&pRVar6[*(uint *)(uVar92 + 0x4c + lVar68)].ptr[2].numPrimitives;
        lVar83 = *(long *)(lVar10 + lVar83);
        uVar81 = (ulong)*(uint *)(uVar92 + 0xc + lVar68);
        auVar140 = *(undefined1 (*) [16])(lVar83 + uVar81 * 4);
        uVar88 = (ulong)*(uint *)(uVar92 + 0x1c + lVar68);
        auVar116 = *(undefined1 (*) [16])(lVar83 + uVar88 * 4);
        auVar123 = vunpcklps_avx(auVar98,auVar135);
        auVar135 = vunpckhps_avx(auVar98,auVar135);
        auVar131 = vunpcklps_avx(auVar128,auVar140);
        auVar128 = vunpckhps_avx(auVar128,auVar140);
        uVar84 = (ulong)*(uint *)(uVar92 + 0x2c + lVar68);
        auVar98 = *(undefined1 (*) [16])(lVar83 + uVar84 * 4);
        _local_1350 = vunpcklps_avx(auVar135,auVar128);
        _local_1390 = vunpcklps_avx(auVar123,auVar131);
        _local_1370 = vunpckhps_avx(auVar123,auVar131);
        auVar135 = vunpcklps_avx(auVar115,auVar136);
        auVar128 = vunpckhps_avx(auVar115,auVar136);
        auVar136 = vunpcklps_avx(auVar129,auVar116);
        auVar129 = vunpckhps_avx(auVar129,auVar116);
        uVar87 = (ulong)*(uint *)(uVar92 + 0x3c + lVar68);
        auVar115 = *(undefined1 (*) [16])(lVar83 + uVar87 * 4);
        _local_1340 = vunpcklps_avx(auVar128,auVar129);
        _local_1380 = vunpcklps_avx(auVar135,auVar136);
        _local_1360 = vunpckhps_avx(auVar135,auVar136);
        auVar129 = vunpcklps_avx(auVar97,auVar137);
        auVar97 = vunpckhps_avx(auVar97,auVar137);
        auVar135 = vunpcklps_avx(auVar130,auVar98);
        auVar128 = vunpckhps_avx(auVar130,auVar98);
        lVar90 = (long)(iVar70 + 1) * 0x38;
        lVar83 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar90);
        auVar98 = *(undefined1 (*) [16])(lVar83 + (ulong)*(uint *)(uVar92 + lVar68) * 4);
        _local_13a0 = vunpcklps_avx(auVar97,auVar128);
        _local_13e0 = vunpcklps_avx(auVar129,auVar135);
        _local_13d0 = vunpckhps_avx(auVar129,auVar135);
        auVar128 = vunpcklps_avx(auVar151,auVar139);
        auVar97 = vunpckhps_avx(auVar151,auVar139);
        auVar129 = vunpcklps_avx(auVar134,auVar115);
        auVar151 = vunpckhps_avx(auVar134,auVar115);
        lVar9 = *(long *)(lVar9 + lVar90);
        auVar115 = *(undefined1 (*) [16])(lVar9 + uVar80 * 4);
        _local_13b0 = vunpcklps_avx(auVar97,auVar151);
        auVar130 = vunpcklps_avx(auVar128,auVar129);
        _local_13c0 = vunpckhps_avx(auVar128,auVar129);
        lVar8 = *(long *)(lVar8 + lVar90);
        auVar151 = vunpcklps_avx(auVar98,auVar115);
        auVar97 = vunpckhps_avx(auVar98,auVar115);
        auVar98 = *(undefined1 (*) [16])(lVar8 + uVar82 * 4);
        lVar10 = *(long *)(lVar10 + lVar90);
        auVar115 = *(undefined1 (*) [16])(lVar10 + uVar81 * 4);
        auVar128 = vunpcklps_avx(auVar98,auVar115);
        auVar98 = vunpckhps_avx(auVar98,auVar115);
        auVar134 = vunpcklps_avx(auVar97,auVar98);
        auVar135 = vunpcklps_avx(auVar151,auVar128);
        auVar97 = vunpckhps_avx(auVar151,auVar128);
        auVar98 = *(undefined1 (*) [16])(lVar83 + uVar74 * 4);
        auVar115 = *(undefined1 (*) [16])(lVar9 + uVar94 * 4);
        auVar128 = vunpcklps_avx(auVar98,auVar115);
        auVar151 = vunpckhps_avx(auVar98,auVar115);
        auVar98 = *(undefined1 (*) [16])(lVar8 + uVar77 * 4);
        auVar115 = *(undefined1 (*) [16])(lVar10 + uVar88 * 4);
        auVar129 = vunpcklps_avx(auVar98,auVar115);
        auVar98 = vunpckhps_avx(auVar98,auVar115);
        auVar136 = vunpcklps_avx(auVar151,auVar98);
        auVar137 = vunpcklps_avx(auVar128,auVar129);
        auVar151 = vunpckhps_avx(auVar128,auVar129);
        auVar98 = *(undefined1 (*) [16])(lVar83 + uVar75 * 4);
        auVar115 = *(undefined1 (*) [16])(lVar9 + uVar85 * 4);
        auVar129 = vunpcklps_avx(auVar98,auVar115);
        auVar128 = vunpckhps_avx(auVar98,auVar115);
        auVar98 = *(undefined1 (*) [16])(lVar8 + uVar78 * 4);
        auVar115 = *(undefined1 (*) [16])(lVar10 + uVar84 * 4);
        auVar139 = vunpcklps_avx(auVar98,auVar115);
        auVar98 = vunpckhps_avx(auVar98,auVar115);
        auVar140 = vunpcklps_avx(auVar128,auVar98);
        auVar116 = vunpcklps_avx(auVar129,auVar139);
        auVar128 = vunpckhps_avx(auVar129,auVar139);
        auVar98 = *(undefined1 (*) [16])(lVar83 + uVar76 * 4);
        auVar115 = *(undefined1 (*) [16])(lVar9 + uVar86 * 4);
        auVar139 = vunpcklps_avx(auVar98,auVar115);
        auVar129 = vunpckhps_avx(auVar98,auVar115);
        auVar98 = *(undefined1 (*) [16])(lVar8 + uVar79 * 4);
        auVar115 = *(undefined1 (*) [16])(lVar10 + uVar87 * 4);
        auVar123 = vunpcklps_avx(auVar98,auVar115);
        auVar98 = vunpckhps_avx(auVar98,auVar115);
        auVar131 = vunpcklps_avx(auVar129,auVar98);
        auVar141 = vunpcklps_avx(auVar139,auVar123);
        auVar129 = vunpckhps_avx(auVar139,auVar123);
        auVar98 = vshufps_avx(local_1330,local_1330,0);
        auVar115 = ZEXT416((uint)(1.0 - fVar95));
        auVar115 = vshufps_avx(auVar115,auVar115,0);
        fVar95 = auVar98._0_4_;
        fVar109 = auVar98._4_4_;
        fVar110 = auVar98._8_4_;
        fVar111 = auVar98._12_4_;
        fVar112 = auVar115._0_4_;
        fVar113 = auVar115._4_4_;
        fVar114 = auVar115._8_4_;
        fVar122 = auVar115._12_4_;
        auVar144._4_4_ = fVar113 * (float)local_1390._4_4_ + auVar135._4_4_ * fVar109;
        auVar144._0_4_ = fVar112 * (float)local_1390._0_4_ + auVar135._0_4_ * fVar95;
        auVar144._8_4_ = fVar114 * fStack_1388 + auVar135._8_4_ * fVar110;
        auVar144._12_4_ = fVar122 * fStack_1384 + auVar135._12_4_ * fVar111;
        auVar152._4_4_ = fVar113 * (float)local_1370._4_4_ + fVar109 * auVar97._4_4_;
        auVar152._0_4_ = fVar112 * (float)local_1370._0_4_ + fVar95 * auVar97._0_4_;
        auVar152._8_4_ = fVar114 * fStack_1368 + fVar110 * auVar97._8_4_;
        auVar152._12_4_ = fVar122 * fStack_1364 + fVar111 * auVar97._12_4_;
        auVar183._4_4_ = fVar113 * (float)local_1350._4_4_ + auVar134._4_4_ * fVar109;
        auVar183._0_4_ = fVar112 * (float)local_1350._0_4_ + auVar134._0_4_ * fVar95;
        auVar183._8_4_ = fVar114 * fStack_1348 + auVar134._8_4_ * fVar110;
        auVar183._12_4_ = fVar122 * fStack_1344 + auVar134._12_4_ * fVar111;
        auVar145._0_4_ = fVar112 * (float)local_1380._0_4_ + fVar95 * auVar137._0_4_;
        auVar145._4_4_ = fVar113 * (float)local_1380._4_4_ + fVar109 * auVar137._4_4_;
        auVar145._8_4_ = fVar114 * fStack_1378 + fVar110 * auVar137._8_4_;
        auVar145._12_4_ = fVar122 * fStack_1374 + fVar111 * auVar137._12_4_;
        auVar124._0_4_ = fVar112 * (float)local_1360._0_4_ + auVar151._0_4_ * fVar95;
        auVar124._4_4_ = fVar113 * (float)local_1360._4_4_ + auVar151._4_4_ * fVar109;
        auVar124._8_4_ = fVar114 * fStack_1358 + auVar151._8_4_ * fVar110;
        auVar124._12_4_ = fVar122 * fStack_1354 + auVar151._12_4_ * fVar111;
        auVar202._0_4_ = fVar112 * (float)local_1340._0_4_ + auVar136._0_4_ * fVar95;
        auVar202._4_4_ = fVar113 * (float)local_1340._4_4_ + auVar136._4_4_ * fVar109;
        auVar202._8_4_ = fVar114 * fStack_1338 + auVar136._8_4_ * fVar110;
        auVar202._12_4_ = fVar122 * fStack_1334 + auVar136._12_4_ * fVar111;
        auVar144._20_4_ = fVar113 * (float)local_13e0._4_4_ + fVar109 * auVar116._4_4_;
        auVar144._16_4_ = fVar112 * (float)local_13e0._0_4_ + fVar95 * auVar116._0_4_;
        auVar144._24_4_ = fVar114 * fStack_13d8 + fVar110 * auVar116._8_4_;
        auVar144._28_4_ = fVar122 * fStack_13d4 + fVar111 * auVar116._12_4_;
        auVar152._20_4_ = fVar113 * (float)local_13d0._4_4_ + auVar128._4_4_ * fVar109;
        auVar152._16_4_ = fVar112 * (float)local_13d0._0_4_ + auVar128._0_4_ * fVar95;
        auVar152._24_4_ = fVar114 * fStack_13c8 + auVar128._8_4_ * fVar110;
        auVar152._28_4_ = fVar122 * fStack_13c4 + auVar128._12_4_ * fVar111;
        auVar183._20_4_ = fVar113 * (float)local_13a0._4_4_ + auVar140._4_4_ * fVar109;
        auVar183._16_4_ = fVar112 * (float)local_13a0._0_4_ + auVar140._0_4_ * fVar95;
        auVar183._24_4_ = fVar114 * fStack_1398 + auVar140._8_4_ * fVar110;
        fVar166 = fVar122 * fStack_1394 + auVar140._12_4_ * fVar111;
        auVar183._28_4_ = fVar166;
        lVar8 = uVar92 + 0x40 + lVar68;
        local_10e0 = *(undefined8 *)(lVar8 + 0x10);
        uStack_10d8 = *(undefined8 *)(lVar8 + 0x18);
        auVar138._0_4_ = auVar130._0_4_ * fVar112 + fVar95 * auVar141._0_4_;
        auVar138._4_4_ = auVar130._4_4_ * fVar113 + fVar109 * auVar141._4_4_;
        auVar138._8_4_ = auVar130._8_4_ * fVar114 + fVar110 * auVar141._8_4_;
        auVar138._12_4_ = auVar130._12_4_ * fVar122 + fVar111 * auVar141._12_4_;
        uStack_10d0 = local_10e0;
        uStack_10c8 = uStack_10d8;
        lVar68 = uVar92 + 0x50 + lVar68;
        local_1320 = *(undefined8 *)(lVar68 + 0x10);
        uStack_1318 = *(undefined8 *)(lVar68 + 0x18);
        auVar142._0_4_ = fVar112 * (float)local_13c0._0_4_ + fVar95 * auVar129._0_4_;
        auVar142._4_4_ = fVar113 * (float)local_13c0._4_4_ + fVar109 * auVar129._4_4_;
        auVar142._8_4_ = fVar114 * fStack_13b8 + fVar110 * auVar129._8_4_;
        auVar142._12_4_ = fVar122 * fStack_13b4 + fVar111 * auVar129._12_4_;
        auVar96._0_4_ = fVar112 * (float)local_13b0._0_4_ + fVar95 * auVar131._0_4_;
        auVar96._4_4_ = fVar113 * (float)local_13b0._4_4_ + fVar109 * auVar131._4_4_;
        auVar96._8_4_ = fVar114 * fStack_13a8 + fVar110 * auVar131._8_4_;
        auVar96._12_4_ = fVar122 * fStack_13a4 + fVar111 * auVar131._12_4_;
        uStack_1310 = local_1320;
        uStack_1308 = uStack_1318;
        auVar117._16_16_ = auVar145;
        auVar117._0_16_ = auVar145;
        auVar125._16_16_ = auVar124;
        auVar125._0_16_ = auVar124;
        auVar146._16_16_ = auVar202;
        auVar146._0_16_ = auVar202;
        auVar161._16_16_ = auVar138;
        auVar161._0_16_ = auVar138;
        auVar143._16_16_ = auVar142;
        auVar143._0_16_ = auVar142;
        auVar99._16_16_ = auVar96;
        auVar99._0_16_ = auVar96;
        auVar106 = vsubps_avx(auVar144,auVar117);
        auVar132 = vsubps_avx(auVar152,auVar125);
        auVar44 = vsubps_avx(auVar183,auVar146);
        auVar101 = vsubps_avx(auVar161,auVar144);
        auVar117 = vsubps_avx(auVar143,auVar152);
        auVar99 = vsubps_avx(auVar99,auVar183);
        fVar111 = auVar132._0_4_;
        fVar184 = auVar99._0_4_;
        fVar149 = auVar132._4_4_;
        fVar185 = auVar99._4_4_;
        auVar45._4_4_ = fVar185 * fVar149;
        auVar45._0_4_ = fVar184 * fVar111;
        fVar14 = auVar132._8_4_;
        fVar187 = auVar99._8_4_;
        auVar45._8_4_ = fVar187 * fVar14;
        fVar20 = auVar132._12_4_;
        fVar189 = auVar99._12_4_;
        auVar45._12_4_ = fVar189 * fVar20;
        fVar26 = auVar132._16_4_;
        fVar190 = auVar99._16_4_;
        auVar45._16_4_ = fVar190 * fVar26;
        fVar32 = auVar132._20_4_;
        fVar191 = auVar99._20_4_;
        auVar45._20_4_ = fVar191 * fVar32;
        fVar38 = auVar132._24_4_;
        fVar192 = auVar99._24_4_;
        auVar45._24_4_ = fVar192 * fVar38;
        auVar45._28_4_ = auVar96._12_4_;
        fVar112 = auVar44._0_4_;
        fVar176 = auVar117._0_4_;
        fVar186 = auVar44._4_4_;
        fVar177 = auVar117._4_4_;
        auVar46._4_4_ = fVar177 * fVar186;
        auVar46._0_4_ = fVar176 * fVar112;
        fVar15 = auVar44._8_4_;
        fVar178 = auVar117._8_4_;
        auVar46._8_4_ = fVar178 * fVar15;
        fVar21 = auVar44._12_4_;
        fVar179 = auVar117._12_4_;
        auVar46._12_4_ = fVar179 * fVar21;
        fVar27 = auVar44._16_4_;
        fVar180 = auVar117._16_4_;
        auVar46._16_4_ = fVar180 * fVar27;
        fVar33 = auVar44._20_4_;
        fVar181 = auVar117._20_4_;
        auVar46._20_4_ = fVar181 * fVar33;
        fVar39 = auVar44._24_4_;
        fVar182 = auVar117._24_4_;
        auVar46._24_4_ = fVar182 * fVar39;
        auVar46._28_4_ = auVar145._12_4_;
        local_1280 = vsubps_avx(auVar46,auVar45);
        fVar160 = auVar101._0_4_;
        fVar163 = auVar101._4_4_;
        auVar44._4_4_ = fVar163 * fVar186;
        auVar44._0_4_ = fVar160 * fVar112;
        fVar164 = auVar101._8_4_;
        auVar44._8_4_ = fVar164 * fVar15;
        fVar167 = auVar101._12_4_;
        auVar44._12_4_ = fVar167 * fVar21;
        fVar169 = auVar101._16_4_;
        auVar44._16_4_ = fVar169 * fVar27;
        fVar171 = auVar101._20_4_;
        auVar44._20_4_ = fVar171 * fVar33;
        fVar173 = auVar101._24_4_;
        auVar44._24_4_ = fVar173 * fVar39;
        auVar44._28_4_ = auVar145._12_4_;
        fVar193 = auVar106._0_4_;
        fVar196 = auVar106._4_4_;
        auVar47._4_4_ = fVar196 * fVar185;
        auVar47._0_4_ = fVar193 * fVar184;
        fVar197 = auVar106._8_4_;
        auVar47._8_4_ = fVar197 * fVar187;
        fVar198 = auVar106._12_4_;
        auVar47._12_4_ = fVar198 * fVar189;
        fVar199 = auVar106._16_4_;
        auVar47._16_4_ = fVar199 * fVar190;
        fVar200 = auVar106._20_4_;
        auVar47._20_4_ = fVar200 * fVar191;
        fVar201 = auVar106._24_4_;
        auVar47._24_4_ = fVar201 * fVar192;
        auVar47._28_4_ = auVar124._12_4_;
        _local_1500 = vsubps_avx(auVar47,auVar44);
        auVar48._4_4_ = fVar196 * fVar177;
        auVar48._0_4_ = fVar193 * fVar176;
        auVar48._8_4_ = fVar197 * fVar178;
        auVar48._12_4_ = fVar198 * fVar179;
        auVar48._16_4_ = fVar199 * fVar180;
        auVar48._20_4_ = fVar200 * fVar181;
        auVar48._24_4_ = fVar201 * fVar182;
        auVar48._28_4_ = auVar124._12_4_;
        auVar49._4_4_ = fVar163 * fVar149;
        auVar49._0_4_ = fVar160 * fVar111;
        auVar49._8_4_ = fVar164 * fVar14;
        auVar49._12_4_ = fVar167 * fVar20;
        auVar49._16_4_ = fVar169 * fVar26;
        auVar49._20_4_ = fVar171 * fVar32;
        auVar49._24_4_ = fVar173 * fVar38;
        auVar49._28_4_ = auVar142._12_4_;
        uVar65 = *(undefined4 *)(ray + k * 4);
        auVar194._4_4_ = uVar65;
        auVar194._0_4_ = uVar65;
        auVar194._8_4_ = uVar65;
        auVar194._12_4_ = uVar65;
        auVar194._16_4_ = uVar65;
        auVar194._20_4_ = uVar65;
        auVar194._24_4_ = uVar65;
        auVar194._28_4_ = uVar65;
        uVar65 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar203._4_4_ = uVar65;
        auVar203._0_4_ = uVar65;
        auVar203._8_4_ = uVar65;
        auVar203._12_4_ = uVar65;
        auVar203._16_4_ = uVar65;
        auVar203._20_4_ = uVar65;
        auVar203._24_4_ = uVar65;
        auVar203._28_4_ = uVar65;
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar204._4_4_ = uVar4;
        auVar204._0_4_ = uVar4;
        auVar204._8_4_ = uVar4;
        auVar204._12_4_ = uVar4;
        auVar204._16_4_ = uVar4;
        auVar204._20_4_ = uVar4;
        auVar204._24_4_ = uVar4;
        auVar204._28_4_ = uVar4;
        fVar95 = *(float *)(ray + k * 4 + 0xa0);
        local_14a0 = vsubps_avx(auVar49,auVar48);
        local_1480 = vsubps_avx(auVar144,auVar194);
        fVar109 = *(float *)(ray + k * 4 + 0xc0);
        auVar106 = vsubps_avx(auVar152,auVar203);
        auVar132 = vsubps_avx(auVar183,auVar204);
        fVar150 = auVar132._0_4_;
        fVar154 = auVar132._4_4_;
        auVar50._4_4_ = fVar154 * fVar95;
        auVar50._0_4_ = fVar150 * fVar95;
        fVar155 = auVar132._8_4_;
        auVar50._8_4_ = fVar155 * fVar95;
        fVar156 = auVar132._12_4_;
        auVar50._12_4_ = fVar156 * fVar95;
        fVar157 = auVar132._16_4_;
        auVar50._16_4_ = fVar157 * fVar95;
        fVar158 = auVar132._20_4_;
        auVar50._20_4_ = fVar158 * fVar95;
        fVar159 = auVar132._24_4_;
        auVar50._24_4_ = fVar159 * fVar95;
        auVar50._28_4_ = fVar166;
        fVar113 = auVar106._0_4_;
        fVar188 = auVar106._4_4_;
        auVar51._4_4_ = fVar109 * fVar188;
        auVar51._0_4_ = fVar109 * fVar113;
        fVar16 = auVar106._8_4_;
        auVar51._8_4_ = fVar109 * fVar16;
        fVar22 = auVar106._12_4_;
        auVar51._12_4_ = fVar109 * fVar22;
        fVar28 = auVar106._16_4_;
        auVar51._16_4_ = fVar109 * fVar28;
        fVar34 = auVar106._20_4_;
        auVar51._20_4_ = fVar109 * fVar34;
        fVar40 = auVar106._24_4_;
        auVar51._24_4_ = fVar109 * fVar40;
        auVar51._28_4_ = uVar65;
        auVar132 = vsubps_avx(auVar51,auVar50);
        fVar110 = *(float *)(ray + k * 4 + 0x80);
        fVar114 = local_1480._0_4_;
        fVar3 = local_1480._4_4_;
        auVar52._4_4_ = fVar109 * fVar3;
        auVar52._0_4_ = fVar109 * fVar114;
        fVar17 = local_1480._8_4_;
        auVar52._8_4_ = fVar109 * fVar17;
        fVar23 = local_1480._12_4_;
        auVar52._12_4_ = fVar109 * fVar23;
        fVar29 = local_1480._16_4_;
        auVar52._16_4_ = fVar109 * fVar29;
        fVar35 = local_1480._20_4_;
        auVar52._20_4_ = fVar109 * fVar35;
        fVar41 = local_1480._24_4_;
        auVar52._24_4_ = fVar109 * fVar41;
        auVar52._28_4_ = uVar4;
        auVar53._4_4_ = fVar154 * fVar110;
        auVar53._0_4_ = fVar150 * fVar110;
        auVar53._8_4_ = fVar155 * fVar110;
        auVar53._12_4_ = fVar156 * fVar110;
        auVar53._16_4_ = fVar157 * fVar110;
        auVar53._20_4_ = fVar158 * fVar110;
        auVar53._24_4_ = fVar159 * fVar110;
        auVar53._28_4_ = auVar145._12_4_;
        auVar44 = vsubps_avx(auVar53,auVar52);
        auVar54._4_4_ = fVar110 * fVar188;
        auVar54._0_4_ = fVar110 * fVar113;
        auVar54._8_4_ = fVar110 * fVar16;
        auVar54._12_4_ = fVar110 * fVar22;
        auVar54._16_4_ = fVar110 * fVar28;
        auVar54._20_4_ = fVar110 * fVar34;
        auVar54._24_4_ = fVar110 * fVar40;
        auVar54._28_4_ = uVar4;
        auVar55._4_4_ = fVar3 * fVar95;
        auVar55._0_4_ = fVar114 * fVar95;
        auVar55._8_4_ = fVar17 * fVar95;
        auVar55._12_4_ = fVar23 * fVar95;
        auVar55._16_4_ = fVar29 * fVar95;
        auVar55._20_4_ = fVar35 * fVar95;
        auVar55._24_4_ = fVar41 * fVar95;
        auVar55._28_4_ = local_1480._28_4_;
        auVar45 = vsubps_avx(auVar55,auVar54);
        fVar122 = local_14a0._0_4_;
        fVar12 = local_14a0._4_4_;
        fVar18 = local_14a0._8_4_;
        fVar24 = local_14a0._12_4_;
        fVar30 = local_14a0._16_4_;
        fVar36 = local_14a0._20_4_;
        fVar42 = local_14a0._24_4_;
        fVar166 = local_1280._0_4_;
        fVar13 = local_1280._4_4_;
        fVar19 = local_1280._8_4_;
        fVar25 = local_1280._12_4_;
        fVar31 = local_1280._16_4_;
        fVar37 = local_1280._20_4_;
        fVar43 = local_1280._24_4_;
        auVar100._0_4_ = fVar110 * fVar166 + fVar109 * fVar122 + (float)local_1500._0_4_ * fVar95;
        auVar100._4_4_ = fVar110 * fVar13 + fVar109 * fVar12 + (float)local_1500._4_4_ * fVar95;
        auVar100._8_4_ = fVar110 * fVar19 + fVar109 * fVar18 + fStack_14f8 * fVar95;
        auVar100._12_4_ = fVar110 * fVar25 + fVar109 * fVar24 + fStack_14f4 * fVar95;
        auVar100._16_4_ = fVar110 * fVar31 + fVar109 * fVar30 + fStack_14f0 * fVar95;
        auVar100._20_4_ = fVar110 * fVar37 + fVar109 * fVar36 + fStack_14ec * fVar95;
        auVar100._24_4_ = fVar110 * fVar43 + fVar109 * fVar42 + fStack_14e8 * fVar95;
        auVar100._28_4_ = fVar109 + fVar109 + fVar95;
        auVar126._8_4_ = 0x80000000;
        auVar126._0_8_ = 0x8000000080000000;
        auVar126._12_4_ = 0x80000000;
        auVar126._16_4_ = 0x80000000;
        auVar126._20_4_ = 0x80000000;
        auVar126._24_4_ = 0x80000000;
        auVar126._28_4_ = 0x80000000;
        auVar106 = vandps_avx(auVar100,auVar126);
        uVar73 = auVar106._0_4_;
        auVar133._0_4_ =
             (float)(uVar73 ^ (uint)(fVar160 * auVar132._0_4_ +
                                    fVar184 * auVar45._0_4_ + fVar176 * auVar44._0_4_));
        uVar66 = auVar106._4_4_;
        auVar133._4_4_ =
             (float)(uVar66 ^ (uint)(fVar163 * auVar132._4_4_ +
                                    fVar185 * auVar45._4_4_ + fVar177 * auVar44._4_4_));
        uVar165 = auVar106._8_4_;
        auVar133._8_4_ =
             (float)(uVar165 ^
                    (uint)(fVar164 * auVar132._8_4_ +
                          fVar187 * auVar45._8_4_ + fVar178 * auVar44._8_4_));
        uVar168 = auVar106._12_4_;
        auVar133._12_4_ =
             (float)(uVar168 ^
                    (uint)(fVar167 * auVar132._12_4_ +
                          fVar189 * auVar45._12_4_ + fVar179 * auVar44._12_4_));
        uVar170 = auVar106._16_4_;
        auVar133._16_4_ =
             (float)(uVar170 ^
                    (uint)(fVar169 * auVar132._16_4_ +
                          fVar190 * auVar45._16_4_ + fVar180 * auVar44._16_4_));
        uVar172 = auVar106._20_4_;
        auVar133._20_4_ =
             (float)(uVar172 ^
                    (uint)(fVar171 * auVar132._20_4_ +
                          fVar191 * auVar45._20_4_ + fVar181 * auVar44._20_4_));
        uVar174 = auVar106._24_4_;
        auVar133._24_4_ =
             (float)(uVar174 ^
                    (uint)(fVar173 * auVar132._24_4_ +
                          fVar192 * auVar45._24_4_ + fVar182 * auVar44._24_4_));
        uVar175 = auVar106._28_4_;
        auVar133._28_4_ =
             (float)(uVar175 ^ (uint)(auVar101._28_4_ + auVar99._28_4_ + auVar117._28_4_));
        local_12e0._0_4_ =
             (float)(uVar73 ^ (uint)(auVar132._0_4_ * fVar193 +
                                    fVar112 * auVar45._0_4_ + fVar111 * auVar44._0_4_));
        local_12e0._4_4_ =
             (float)(uVar66 ^ (uint)(auVar132._4_4_ * fVar196 +
                                    fVar186 * auVar45._4_4_ + fVar149 * auVar44._4_4_));
        local_12e0._8_4_ =
             (float)(uVar165 ^
                    (uint)(auVar132._8_4_ * fVar197 +
                          fVar15 * auVar45._8_4_ + fVar14 * auVar44._8_4_));
        local_12e0._12_4_ =
             (float)(uVar168 ^
                    (uint)(auVar132._12_4_ * fVar198 +
                          fVar21 * auVar45._12_4_ + fVar20 * auVar44._12_4_));
        local_12e0._16_4_ =
             (float)(uVar170 ^
                    (uint)(auVar132._16_4_ * fVar199 +
                          fVar27 * auVar45._16_4_ + fVar26 * auVar44._16_4_));
        local_12e0._20_4_ =
             (float)(uVar172 ^
                    (uint)(auVar132._20_4_ * fVar200 +
                          fVar33 * auVar45._20_4_ + fVar32 * auVar44._20_4_));
        local_12e0._24_4_ =
             (float)(uVar174 ^
                    (uint)(auVar132._24_4_ * fVar201 +
                          fVar39 * auVar45._24_4_ + fVar38 * auVar44._24_4_));
        local_12e0._28_4_ = (float)(uVar175 ^ (uint)(auVar45._28_4_ + auVar44._28_4_ + -0.0));
        auVar132 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar106 = vcmpps_avx(auVar133,auVar132,5);
        auVar132 = vcmpps_avx(local_12e0,auVar132,5);
        auVar106 = vandps_avx(auVar106,auVar132);
        auVar127._8_4_ = 0x7fffffff;
        auVar127._0_8_ = 0x7fffffff7fffffff;
        auVar127._12_4_ = 0x7fffffff;
        auVar127._16_4_ = 0x7fffffff;
        auVar127._20_4_ = 0x7fffffff;
        auVar127._24_4_ = 0x7fffffff;
        auVar127._28_4_ = 0x7fffffff;
        local_12a0 = vandps_avx(auVar100,auVar127);
        auVar132 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar100,4);
        auVar106 = vandps_avx(auVar106,auVar132);
        auVar101._0_4_ = auVar133._0_4_ + local_12e0._0_4_;
        auVar101._4_4_ = auVar133._4_4_ + local_12e0._4_4_;
        auVar101._8_4_ = auVar133._8_4_ + local_12e0._8_4_;
        auVar101._12_4_ = auVar133._12_4_ + local_12e0._12_4_;
        auVar101._16_4_ = auVar133._16_4_ + local_12e0._16_4_;
        auVar101._20_4_ = auVar133._20_4_ + local_12e0._20_4_;
        auVar101._24_4_ = auVar133._24_4_ + local_12e0._24_4_;
        auVar101._28_4_ = auVar133._28_4_ + local_12e0._28_4_;
        auVar132 = vcmpps_avx(auVar101,local_12a0,2);
        auVar44 = auVar132 & auVar106;
        if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar44 >> 0x7f,0) != '\0') ||
              (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar44 >> 0xbf,0) != '\0') ||
            (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar44[0x1f] < '\0') {
          auVar106 = vandps_avx(auVar106,auVar132);
          auVar98 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
          local_12c0._0_4_ =
               (float)(uVar73 ^ (uint)(fVar166 * fVar114 +
                                      (float)local_1500._0_4_ * fVar113 + fVar150 * fVar122));
          local_12c0._4_4_ =
               (float)(uVar66 ^ (uint)(fVar13 * fVar3 +
                                      (float)local_1500._4_4_ * fVar188 + fVar154 * fVar12));
          local_12c0._8_4_ =
               (float)(uVar165 ^ (uint)(fVar19 * fVar17 + fStack_14f8 * fVar16 + fVar155 * fVar18));
          local_12c0._12_4_ =
               (float)(uVar168 ^ (uint)(fVar25 * fVar23 + fStack_14f4 * fVar22 + fVar156 * fVar24));
          local_12c0._16_4_ =
               (float)(uVar170 ^ (uint)(fVar31 * fVar29 + fStack_14f0 * fVar28 + fVar157 * fVar30));
          local_12c0._20_4_ =
               (float)(uVar172 ^ (uint)(fVar37 * fVar35 + fStack_14ec * fVar34 + fVar158 * fVar36));
          local_12c0._24_4_ =
               (float)(uVar174 ^ (uint)(fVar43 * fVar41 + fStack_14e8 * fVar40 + fVar159 * fVar42));
          local_12c0._28_4_ = uVar175 ^ 0x7fc00000;
          fVar95 = *(float *)(ray + k * 4 + 0x60);
          fVar109 = local_12a0._0_4_;
          fVar110 = local_12a0._4_4_;
          auVar56._4_4_ = fVar110 * fVar95;
          auVar56._0_4_ = fVar109 * fVar95;
          fVar111 = local_12a0._8_4_;
          auVar56._8_4_ = fVar111 * fVar95;
          fVar112 = local_12a0._12_4_;
          auVar56._12_4_ = fVar112 * fVar95;
          fVar113 = local_12a0._16_4_;
          auVar56._16_4_ = fVar113 * fVar95;
          fVar114 = local_12a0._20_4_;
          auVar56._20_4_ = fVar114 * fVar95;
          fVar149 = local_12a0._24_4_;
          auVar56._24_4_ = fVar149 * fVar95;
          auVar56._28_4_ = fVar95;
          auVar106 = vcmpps_avx(auVar56,local_12c0,1);
          fVar95 = *(float *)(ray + k * 4 + 0x100);
          auVar57._4_4_ = fVar110 * fVar95;
          auVar57._0_4_ = fVar109 * fVar95;
          auVar57._8_4_ = fVar111 * fVar95;
          auVar57._12_4_ = fVar112 * fVar95;
          auVar57._16_4_ = fVar113 * fVar95;
          auVar57._20_4_ = fVar114 * fVar95;
          auVar57._24_4_ = fVar149 * fVar95;
          auVar57._28_4_ = fVar95;
          auVar132 = vcmpps_avx(local_12c0,auVar57,2);
          auVar106 = vandps_avx(auVar106,auVar132);
          auVar115 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
          auVar98 = vpand_avx(auVar115,auVar98);
          auVar115 = vpmovzxwd_avx(auVar98);
          auVar151 = vpslld_avx(auVar115,0x1f);
          auVar97 = vpsrad_avx(auVar151,0x1f);
          auVar115 = vpunpckhwd_avx(auVar98,auVar98);
          auVar115 = vpslld_avx(auVar115,0x1f);
          auVar115 = vpsrad_avx(auVar115,0x1f);
          local_14c0._16_16_ = auVar115;
          local_14c0._0_16_ = auVar97;
          if ((((((((local_14c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_14c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_14c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_14c0 >> 0x7f,0) != '\0') ||
                (local_14c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar115 >> 0x3f,0) != '\0') ||
              (local_14c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar115[0xf] < '\0') {
            local_1300 = auVar133;
            local_1260 = (float)local_1500._0_4_;
            fStack_125c = (float)local_1500._4_4_;
            fStack_1258 = fStack_14f8;
            fStack_1254 = fStack_14f4;
            fStack_1250 = fStack_14f0;
            fStack_124c = fStack_14ec;
            fStack_1248 = fStack_14e8;
            uStack_1244 = uStack_14e4;
            local_1240 = local_14a0;
            local_1220 = local_14c0;
            local_1140 = local_1100;
            auVar132 = vrcpps_avx(local_12a0);
            fVar95 = auVar132._0_4_;
            auVar118._0_4_ = fVar109 * fVar95;
            fVar109 = auVar132._4_4_;
            auVar118._4_4_ = fVar110 * fVar109;
            fVar110 = auVar132._8_4_;
            auVar118._8_4_ = fVar111 * fVar110;
            fVar111 = auVar132._12_4_;
            auVar118._12_4_ = fVar112 * fVar111;
            fVar112 = auVar132._16_4_;
            auVar118._16_4_ = fVar113 * fVar112;
            fVar113 = auVar132._20_4_;
            auVar118._20_4_ = fVar114 * fVar113;
            fVar114 = auVar132._24_4_;
            auVar118._24_4_ = fVar149 * fVar114;
            auVar118._28_4_ = 0;
            auVar147._8_4_ = 0x3f800000;
            auVar147._0_8_ = &DAT_3f8000003f800000;
            auVar147._12_4_ = 0x3f800000;
            auVar147._16_4_ = 0x3f800000;
            auVar147._20_4_ = 0x3f800000;
            auVar147._24_4_ = 0x3f800000;
            auVar147._28_4_ = 0x3f800000;
            auVar44 = vsubps_avx(auVar147,auVar118);
            fVar95 = fVar95 + fVar95 * auVar44._0_4_;
            fVar109 = fVar109 + fVar109 * auVar44._4_4_;
            fVar110 = fVar110 + fVar110 * auVar44._8_4_;
            fVar111 = fVar111 + fVar111 * auVar44._12_4_;
            fVar112 = fVar112 + fVar112 * auVar44._16_4_;
            fVar113 = fVar113 + fVar113 * auVar44._20_4_;
            fVar114 = fVar114 + fVar114 * auVar44._24_4_;
            local_11c0._4_4_ = local_12c0._4_4_ * fVar109;
            local_11c0._0_4_ = local_12c0._0_4_ * fVar95;
            local_11c0._8_4_ = local_12c0._8_4_ * fVar110;
            local_11c0._12_4_ = local_12c0._12_4_ * fVar111;
            local_11c0._16_4_ = local_12c0._16_4_ * fVar112;
            local_11c0._20_4_ = local_12c0._20_4_ * fVar113;
            local_11c0._24_4_ = local_12c0._24_4_ * fVar114;
            local_11c0._28_4_ = local_12c0._28_4_;
            auVar108 = ZEXT3264(local_11c0);
            auVar58._4_4_ = fVar109 * auVar133._4_4_;
            auVar58._0_4_ = fVar95 * auVar133._0_4_;
            auVar58._8_4_ = fVar110 * auVar133._8_4_;
            auVar58._12_4_ = fVar111 * auVar133._12_4_;
            auVar58._16_4_ = fVar112 * auVar133._16_4_;
            auVar58._20_4_ = fVar113 * auVar133._20_4_;
            auVar58._24_4_ = fVar114 * auVar133._24_4_;
            auVar58._28_4_ = auVar44._28_4_;
            auVar106 = vminps_avx(auVar58,auVar147);
            auVar59._4_4_ = fVar109 * local_12e0._4_4_;
            auVar59._0_4_ = fVar95 * local_12e0._0_4_;
            auVar59._8_4_ = fVar110 * local_12e0._8_4_;
            auVar59._12_4_ = fVar111 * local_12e0._12_4_;
            auVar59._16_4_ = fVar112 * local_12e0._16_4_;
            auVar59._20_4_ = fVar113 * local_12e0._20_4_;
            auVar59._24_4_ = fVar114 * local_12e0._24_4_;
            auVar59._28_4_ = auVar132._28_4_ + auVar44._28_4_;
            auVar132 = vminps_avx(auVar59,auVar147);
            auVar44 = vsubps_avx(auVar147,auVar106);
            auVar101 = vsubps_avx(auVar147,auVar132);
            local_11e0 = vblendvps_avx(auVar132,auVar44,local_1100);
            local_1200 = vblendvps_avx(auVar106,auVar101,local_1100);
            local_11a0[0] = fVar166 * (float)local_1120._0_4_;
            local_11a0[1] = fVar13 * (float)local_1120._4_4_;
            local_11a0[2] = fVar19 * fStack_1118;
            local_11a0[3] = fVar25 * fStack_1114;
            fStack_1190 = fVar31 * fStack_1110;
            fStack_118c = fVar37 * fStack_110c;
            fStack_1188 = fVar43 * fStack_1108;
            uStack_1184 = local_1200._28_4_;
            local_1180[0] = (float)local_1500._0_4_ * (float)local_1120._0_4_;
            local_1180[1] = (float)local_1500._4_4_ * (float)local_1120._4_4_;
            local_1180[2] = fStack_14f8 * fStack_1118;
            local_1180[3] = fStack_14f4 * fStack_1114;
            fStack_1170 = fStack_14f0 * fStack_1110;
            fStack_116c = fStack_14ec * fStack_110c;
            fStack_1168 = fStack_14e8 * fStack_1108;
            uStack_1164 = auVar106._28_4_;
            local_1160[0] = fVar122 * (float)local_1120._0_4_;
            local_1160[1] = fVar12 * (float)local_1120._4_4_;
            local_1160[2] = fVar18 * fStack_1118;
            local_1160[3] = fVar24 * fStack_1114;
            fStack_1150 = fVar30 * fStack_1110;
            fStack_114c = fVar36 * fStack_110c;
            fStack_1148 = fVar42 * fStack_1108;
            uStack_1144 = uStack_1104;
            auVar115 = vpunpckhwd_avx(auVar98,auVar98);
            auVar115 = vpslld_avx(auVar115,0x1f);
            auVar102._16_16_ = auVar115;
            auVar102._0_16_ = auVar151;
            auVar119._8_4_ = 0x7f800000;
            auVar119._0_8_ = 0x7f8000007f800000;
            auVar119._12_4_ = 0x7f800000;
            auVar119._16_4_ = 0x7f800000;
            auVar119._20_4_ = 0x7f800000;
            auVar119._24_4_ = 0x7f800000;
            auVar119._28_4_ = 0x7f800000;
            auVar106 = vblendvps_avx(auVar119,local_11c0,auVar102);
            auVar132 = vshufps_avx(auVar106,auVar106,0xb1);
            auVar132 = vminps_avx(auVar106,auVar132);
            auVar44 = vshufpd_avx(auVar132,auVar132,5);
            auVar132 = vminps_avx(auVar132,auVar44);
            auVar44 = vperm2f128_avx(auVar132,auVar132,1);
            auVar132 = vminps_avx(auVar132,auVar44);
            auVar106 = vcmpps_avx(auVar106,auVar132,0);
            auVar115 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
            auVar98 = vpand_avx(auVar115,auVar98);
            auVar115 = vpmovzxwd_avx(auVar98);
            auVar115 = vpslld_avx(auVar115,0x1f);
            auVar115 = vpsrad_avx(auVar115,0x1f);
            auVar98 = vpunpckhwd_avx(auVar98,auVar98);
            auVar98 = vpslld_avx(auVar98,0x1f);
            auVar98 = vpsrad_avx(auVar98,0x1f);
            auVar103._16_16_ = auVar98;
            auVar103._0_16_ = auVar115;
            if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar103 >> 0x7f,0) == '\0') &&
                  (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar98 >> 0x3f,0) == '\0') &&
                (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar98[0xf]) {
              auVar103 = local_14c0;
            }
            uVar66 = vmovmskps_avx(auVar103);
            uVar73 = 0;
            if (uVar66 != 0) {
              for (; (uVar66 >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
              }
            }
LAB_003eaaf3:
            uVar81 = (ulong)uVar73;
            uVar73 = *(uint *)((long)&local_10e0 + uVar81 * 4);
            pGVar7 = (pSVar5->geometries).items[uVar73].ptr;
            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              *(undefined4 *)(local_14c0 + uVar81 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar65 = *(undefined4 *)(local_1200 + uVar81 * 4);
                uVar4 = *(undefined4 *)(local_11e0 + uVar81 * 4);
                *(float *)(ray + k * 4 + 0x100) = local_11a0[uVar81 - 8];
                *(float *)(ray + k * 4 + 0x180) = local_11a0[uVar81];
                *(float *)(ray + k * 4 + 0x1a0) = local_1180[uVar81];
                *(float *)(ray + k * 4 + 0x1c0) = local_1160[uVar81];
                *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar65;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x220) =
                     *(undefined4 *)((long)&local_1320 + uVar81 * 4);
                *(uint *)(ray + k * 4 + 0x240) = uVar73;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                goto LAB_003ea8c1;
              }
              local_14e0 = auVar108._0_32_;
              uVar65 = *(undefined4 *)(local_1200 + uVar81 * 4);
              local_1060._4_4_ = uVar65;
              local_1060._0_4_ = uVar65;
              local_1060._8_4_ = uVar65;
              local_1060._12_4_ = uVar65;
              local_1060._16_4_ = uVar65;
              local_1060._20_4_ = uVar65;
              local_1060._24_4_ = uVar65;
              local_1060._28_4_ = uVar65;
              local_1040 = *(undefined4 *)(local_11e0 + uVar81 * 4);
              uVar65 = *(undefined4 *)((long)&local_1320 + uVar81 * 4);
              local_1020._4_4_ = uVar65;
              local_1020._0_4_ = uVar65;
              local_1020._8_4_ = uVar65;
              local_1020._12_4_ = uVar65;
              local_1020._16_4_ = uVar65;
              local_1020._20_4_ = uVar65;
              local_1020._24_4_ = uVar65;
              local_1020._28_4_ = uVar65;
              fVar95 = local_11a0[uVar81];
              fVar109 = local_1180[uVar81];
              local_10a0._4_4_ = fVar109;
              local_10a0._0_4_ = fVar109;
              local_10a0._8_4_ = fVar109;
              local_10a0._12_4_ = fVar109;
              local_10a0._16_4_ = fVar109;
              local_10a0._20_4_ = fVar109;
              local_10a0._24_4_ = fVar109;
              local_10a0._28_4_ = fVar109;
              auStack_ff0 = vpshufd_avx(ZEXT416(uVar73),0);
              auVar106 = ZEXT1632(auStack_ff0);
              fVar109 = local_1160[uVar81];
              local_1080._4_4_ = fVar109;
              local_1080._0_4_ = fVar109;
              local_1080._8_4_ = fVar109;
              local_1080._12_4_ = fVar109;
              local_1080._16_4_ = fVar109;
              local_1080._20_4_ = fVar109;
              local_1080._24_4_ = fVar109;
              local_1080._28_4_ = fVar109;
              local_10c0[0] = (RTCHitN)SUB41(fVar95,0);
              local_10c0[1] = (RTCHitN)(char)((uint)fVar95 >> 8);
              local_10c0[2] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
              local_10c0[3] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
              local_10c0[4] = (RTCHitN)SUB41(fVar95,0);
              local_10c0[5] = (RTCHitN)(char)((uint)fVar95 >> 8);
              local_10c0[6] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
              local_10c0[7] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
              local_10c0[8] = (RTCHitN)SUB41(fVar95,0);
              local_10c0[9] = (RTCHitN)(char)((uint)fVar95 >> 8);
              local_10c0[10] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
              local_10c0[0xb] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
              local_10c0[0xc] = (RTCHitN)SUB41(fVar95,0);
              local_10c0[0xd] = (RTCHitN)(char)((uint)fVar95 >> 8);
              local_10c0[0xe] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
              local_10c0[0xf] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
              local_10c0[0x10] = (RTCHitN)SUB41(fVar95,0);
              local_10c0[0x11] = (RTCHitN)(char)((uint)fVar95 >> 8);
              local_10c0[0x12] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
              local_10c0[0x13] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
              local_10c0[0x14] = (RTCHitN)SUB41(fVar95,0);
              local_10c0[0x15] = (RTCHitN)(char)((uint)fVar95 >> 8);
              local_10c0[0x16] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
              local_10c0[0x17] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
              local_10c0[0x18] = (RTCHitN)SUB41(fVar95,0);
              local_10c0[0x19] = (RTCHitN)(char)((uint)fVar95 >> 8);
              local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
              local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
              local_10c0[0x1c] = (RTCHitN)SUB41(fVar95,0);
              local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar95 >> 8);
              local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar95 >> 0x10);
              local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar95 >> 0x18);
              uStack_103c = local_1040;
              uStack_1038 = local_1040;
              uStack_1034 = local_1040;
              uStack_1030 = local_1040;
              uStack_102c = local_1040;
              uStack_1028 = local_1040;
              uStack_1024 = local_1040;
              local_1000 = auStack_ff0;
              vcmpps_avx(local_1060,local_1060,0xf);
              uStack_fdc = context->user->instID[0];
              local_fe0 = uStack_fdc;
              uStack_fd8 = uStack_fdc;
              uStack_fd4 = uStack_fdc;
              uStack_fd0 = uStack_fdc;
              uStack_fcc = uStack_fdc;
              uStack_fc8 = uStack_fdc;
              uStack_fc4 = uStack_fdc;
              uStack_fbc = context->user->instPrimID[0];
              local_fc0 = uStack_fbc;
              uStack_fb8 = uStack_fbc;
              uStack_fb4 = uStack_fbc;
              uStack_fb0 = uStack_fbc;
              uStack_fac = uStack_fbc;
              uStack_fa8 = uStack_fbc;
              uStack_fa4 = uStack_fbc;
              local_1500._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
              *(float *)(ray + k * 4 + 0x100) = local_11a0[uVar81 - 8];
              local_1560 = *(undefined8 *)(mm_lookupmask_ps + uVar71);
              uStack_1558 = *(undefined8 *)(mm_lookupmask_ps + uVar71 + 8);
              local_1550 = *(undefined8 *)(mm_lookupmask_ps + lVar72);
              uStack_1548 = *(undefined8 *)(mm_lookupmask_ps + lVar72 + 8);
              local_1530.valid = (int *)&local_1560;
              local_1530.geometryUserPtr = pGVar7->userPtr;
              local_1530.context = context->user;
              local_1530.hit = local_10c0;
              local_1530.N = 8;
              local_1530.ray = (RTCRayN *)ray;
              if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar106 = ZEXT1632(auStack_ff0);
                (*pGVar7->intersectionFilterN)(&local_1530);
              }
              auVar60._8_8_ = uStack_1558;
              auVar60._0_8_ = local_1560;
              auVar98 = vpcmpeqd_avx((undefined1  [16])0x0,auVar60);
              auVar62._8_8_ = uStack_1548;
              auVar62._0_8_ = local_1550;
              auVar115 = vpcmpeqd_avx((undefined1  [16])0x0,auVar62);
              auVar104._16_16_ = auVar115;
              auVar104._0_16_ = auVar98;
              auVar132 = _DAT_0205a980 & ~auVar104;
              if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar132 >> 0x7f,0) == '\0') &&
                    (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar132 >> 0xbf,0) == '\0') &&
                  (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar132[0x1f]) {
                auVar108 = ZEXT3264(CONCAT428(auVar115._12_4_ ^ 0xffffffff,
                                              CONCAT424(auVar115._8_4_ ^ 0xffffffff,
                                                        CONCAT420(auVar115._4_4_ ^ 0xffffffff,
                                                                  CONCAT416(auVar115._0_4_ ^
                                                                            0xffffffff,
                                                                            CONCAT412(auVar98._12_4_
                                                                                      ^ 0xffffffff,
                                                                                      CONCAT48(
                                                  auVar98._8_4_ ^ 0xffffffff,
                                                  auVar98._0_8_ ^ 0xffffffffffffffff)))))));
              }
              else {
                p_Var11 = context->args->filter;
                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar106 = ZEXT1632(auVar106._0_16_);
                  (*p_Var11)(&local_1530);
                }
                auVar61._8_8_ = uStack_1558;
                auVar61._0_8_ = local_1560;
                auVar98 = vpcmpeqd_avx((undefined1  [16])0x0,auVar61);
                auVar63._8_8_ = uStack_1548;
                auVar63._0_8_ = local_1550;
                auVar115 = vpcmpeqd_avx((undefined1  [16])0x0,auVar63);
                auVar121._16_16_ = auVar115;
                auVar121._0_16_ = auVar98;
                auVar106 = vcmpps_avx(auVar106,auVar106,0xf);
                auVar105._0_4_ = auVar98._0_4_ ^ auVar106._0_4_;
                auVar105._4_4_ = auVar98._4_4_ ^ auVar106._4_4_;
                auVar105._8_4_ = auVar98._8_4_ ^ auVar106._8_4_;
                auVar105._12_4_ = auVar98._12_4_ ^ auVar106._12_4_;
                auVar105._16_4_ = auVar115._0_4_ ^ auVar106._16_4_;
                auVar105._20_4_ = auVar115._4_4_ ^ auVar106._20_4_;
                auVar105._24_4_ = auVar115._8_4_ ^ auVar106._24_4_;
                auVar105._28_4_ = auVar115._12_4_ ^ auVar106._28_4_;
                auVar108 = ZEXT3264(auVar105);
                auVar106 = auVar106 & ~auVar121;
                if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar106 >> 0x7f,0) != '\0') ||
                      (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar106 >> 0xbf,0) != '\0') ||
                    (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar106[0x1f] < '\0') {
                  auVar106 = vmaskmovps_avx(auVar105,*(undefined1 (*) [32])local_1530.hit);
                  *(undefined1 (*) [32])(local_1530.ray + 0x180) = auVar106;
                  auVar106 = vmaskmovps_avx(auVar105,*(undefined1 (*) [32])(local_1530.hit + 0x20));
                  *(undefined1 (*) [32])(local_1530.ray + 0x1a0) = auVar106;
                  auVar106 = vmaskmovps_avx(auVar105,*(undefined1 (*) [32])(local_1530.hit + 0x40));
                  *(undefined1 (*) [32])(local_1530.ray + 0x1c0) = auVar106;
                  auVar106 = vmaskmovps_avx(auVar105,*(undefined1 (*) [32])(local_1530.hit + 0x60));
                  *(undefined1 (*) [32])(local_1530.ray + 0x1e0) = auVar106;
                  auVar106 = vmaskmovps_avx(auVar105,*(undefined1 (*) [32])(local_1530.hit + 0x80));
                  *(undefined1 (*) [32])(local_1530.ray + 0x200) = auVar106;
                  auVar106 = vmaskmovps_avx(auVar105,*(undefined1 (*) [32])(local_1530.hit + 0xa0));
                  *(undefined1 (*) [32])(local_1530.ray + 0x220) = auVar106;
                  auVar106 = vmaskmovps_avx(auVar105,*(undefined1 (*) [32])(local_1530.hit + 0xc0));
                  *(undefined1 (*) [32])(local_1530.ray + 0x240) = auVar106;
                  auVar106 = vmaskmovps_avx(auVar105,*(undefined1 (*) [32])(local_1530.hit + 0xe0));
                  *(undefined1 (*) [32])(local_1530.ray + 0x260) = auVar106;
                  auVar106 = vmaskmovps_avx(auVar105,*(undefined1 (*) [32])(local_1530.hit + 0x100))
                  ;
                  *(undefined1 (*) [32])(local_1530.ray + 0x280) = auVar106;
                }
              }
              auVar106 = auVar108._0_32_;
              if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar106 >> 0x7f,0) == '\0') &&
                    (auVar108 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                   SUB321(auVar106 >> 0xbf,0) == '\0') &&
                  (auVar108 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                  -1 < auVar108[0x1f]) {
                *(undefined4 *)(ray + k * 4 + 0x100) = local_1500._0_4_;
              }
              *(undefined4 *)(local_14c0 + uVar81 * 4) = 0;
              uVar65 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar107._4_4_ = uVar65;
              auVar107._0_4_ = uVar65;
              auVar107._8_4_ = uVar65;
              auVar107._12_4_ = uVar65;
              auVar107._16_4_ = uVar65;
              auVar107._20_4_ = uVar65;
              auVar107._24_4_ = uVar65;
              auVar107._28_4_ = uVar65;
              auVar108 = ZEXT3264(local_14e0);
              auVar106 = vcmpps_avx(local_14e0,auVar107,2);
              local_14c0 = vandps_avx(auVar106,local_14c0);
            }
            if ((((((((local_14c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_14c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_14c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_14c0 >> 0x7f,0) == '\0') &&
                  (local_14c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_14c0 >> 0xbf,0) == '\0') &&
                (local_14c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_14c0[0x1f]) goto LAB_003ea8c1;
            auVar120._8_4_ = 0x7f800000;
            auVar120._0_8_ = 0x7f8000007f800000;
            auVar120._12_4_ = 0x7f800000;
            auVar120._16_4_ = 0x7f800000;
            auVar120._20_4_ = 0x7f800000;
            auVar120._24_4_ = 0x7f800000;
            auVar120._28_4_ = 0x7f800000;
            auVar106 = vblendvps_avx(auVar120,auVar108._0_32_,local_14c0);
            auVar132 = vshufps_avx(auVar106,auVar106,0xb1);
            auVar132 = vminps_avx(auVar106,auVar132);
            auVar44 = vshufpd_avx(auVar132,auVar132,5);
            auVar132 = vminps_avx(auVar132,auVar44);
            auVar44 = vperm2f128_avx(auVar132,auVar132,1);
            auVar132 = vminps_avx(auVar132,auVar44);
            auVar132 = vcmpps_avx(auVar106,auVar132,0);
            auVar44 = local_14c0 & auVar132;
            auVar106 = local_14c0;
            if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar44 >> 0x7f,0) != '\0') ||
                  (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar44 >> 0xbf,0) != '\0') ||
                (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar44[0x1f] < '\0') {
              auVar106 = vandps_avx(auVar132,local_14c0);
            }
            uVar66 = vmovmskps_avx(auVar106);
            uVar73 = 0;
            if (uVar66 != 0) {
              for (; (uVar66 >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
              }
            }
            goto LAB_003eaaf3;
          }
        }
LAB_003ea8c1:
        lVar69 = lVar69 + 1;
      } while (lVar69 != uVar67 - 8);
    }
    uVar65 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar108 = ZEXT1664(CONCAT412(uVar65,CONCAT48(uVar65,CONCAT44(uVar65,uVar65))));
    auVar148 = ZEXT1664(local_13f0);
    auVar153 = ZEXT1664(local_1400);
    auVar162 = ZEXT1664(local_1410);
    auVar195 = ZEXT1664(local_1450);
    fVar95 = local_1420;
    fVar109 = fStack_141c;
    fVar110 = fStack_1418;
    fVar111 = fStack_1414;
    fVar112 = local_1430;
    fVar113 = fStack_142c;
    fVar114 = fStack_1428;
    fVar122 = fStack_1424;
    fVar166 = local_1440;
    fVar149 = fStack_143c;
    fVar186 = fStack_1438;
    fVar188 = fStack_1434;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }